

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
SmallArray<InstructionRegVmFinalizeContext::FixupPoint,_32U>::grow
          (SmallArray<InstructionRegVmFinalizeContext::FixupPoint,_32U> *this,uint newSize)

{
  undefined4 uVar1;
  FixupPoint *pFVar2;
  FixupPoint *pFVar3;
  uint local_24;
  FixupPoint *pFStack_20;
  uint i;
  FixupPoint *newData;
  uint newSize_local;
  SmallArray<InstructionRegVmFinalizeContext::FixupPoint,_32U> *this_local;
  
  if (newSize < this->max + (this->max >> 1)) {
    newData._4_4_ = this->max + (this->max >> 1);
  }
  else {
    newData._4_4_ = newSize + 4;
  }
  if (this->allocator == (Allocator *)0x0) {
    pFStack_20 = NULLC::construct<InstructionRegVmFinalizeContext::FixupPoint>(newData._4_4_);
  }
  else {
    pFStack_20 = Allocator::construct<InstructionRegVmFinalizeContext::FixupPoint>
                           (this->allocator,newData._4_4_);
  }
  for (local_24 = 0; local_24 < this->count; local_24 = local_24 + 1) {
    pFVar3 = this->data + local_24;
    pFVar2 = pFStack_20 + local_24;
    uVar1 = *(undefined4 *)&pFVar3->field_0x4;
    pFVar2->cmdIndex = pFVar3->cmdIndex;
    *(undefined4 *)&pFVar2->field_0x4 = uVar1;
    pFVar2->target = pFVar3->target;
  }
  if (this->data != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      NULLC::destruct<InstructionRegVmFinalizeContext::FixupPoint>(this->data,(ulong)this->max);
    }
    else {
      Allocator::destruct<InstructionRegVmFinalizeContext::FixupPoint>
                (this->allocator,this->data,(ulong)this->max);
    }
  }
  this->data = pFStack_20;
  this->max = newData._4_4_;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}